

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc *psVar1;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  stbi_uc sVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  stbi_uc **ppsVar16;
  stbi_uc *psVar17;
  size_t sVar18;
  stbi_uc *psVar19;
  byte *pbVar20;
  uint uVar21;
  ulong uVar22;
  stbi_uc *psVar23;
  ulong uVar24;
  byte bVar25;
  int iVar26;
  stbi__uint32 raw_len_00;
  uint uVar27;
  size_t __size;
  long lVar28;
  uint depth;
  long lVar29;
  int local_524;
  stbi_uc tc [3];
  ulong local_4d8;
  stbi__uint32 raw_len;
  ulong local_4b8;
  ulong local_4b0;
  stbi_uc *local_4a8;
  stbi_uc *local_4a0;
  stbi_uc *local_498;
  undefined8 local_490;
  stbi_uc *local_488;
  size_t local_480;
  ulong local_478;
  stbi__context *local_470;
  int local_464;
  ulong local_460;
  long local_458;
  ulong local_450;
  long local_448;
  stbi_uc *local_440;
  stbi_uc palette [1024];
  
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar10 = stbi__check_png_header(s);
  if (iVar10 == 0) {
    local_524 = 0;
  }
  else {
    local_524 = 1;
    if (scan != 1) {
      ppsVar16 = &z->idata;
      local_4a0 = s->buffer_start;
      psVar1 = s->buffer_start + 1;
      local_460 = 0;
      bVar5 = true;
      local_4b0 = 0;
      depth = 0;
      bVar6 = false;
      local_4d8 = 0;
      __size = 0;
      local_4b8 = 0;
      local_490 = 0;
      bVar25 = 0;
      do {
        iVar10 = stbi__get16be(s);
        uVar11 = stbi__get16be(s);
        uVar14 = uVar11 + iVar10 * 0x10000;
        uVar12 = stbi__get16be(s);
        uVar13 = stbi__get16be(s);
        psVar17 = local_4a0;
        uVar13 = uVar13 | uVar12 << 0x10;
        uVar15 = (uint)local_4d8;
        if ((int)uVar13 < 0x49484452) {
          if (uVar13 == 0x43674249) {
            bVar6 = true;
LAB_00114361:
            stbi__skip(s,uVar14);
LAB_00115031:
            stbi__get16be(s);
            stbi__get16be(s);
            bVar4 = true;
          }
          else {
            iVar10 = (int)local_4b8;
            if (uVar13 == 0x49444154) {
              if (bVar5) {
LAB_00114405:
                stbi__g_failure_reason = "Corrupt PNG";
                bVar5 = true;
                goto LAB_0011445f;
              }
              if ((bVar25 == 0) || (uVar15 != 0)) {
                if (scan == 2) {
                  s->img_n = (uint)bVar25;
                  local_524 = 1;
LAB_00114562:
                  bVar5 = false;
                  goto LAB_0011514c;
                }
                uVar11 = uVar14 + iVar10;
                if (iVar10 <= (int)uVar11) {
                  if ((uint)__size < uVar11) {
                    sVar18 = 0x1000;
                    if (0x1000 < uVar14) {
                      sVar18 = (ulong)uVar14;
                    }
                    if ((uint)__size != 0) {
                      sVar18 = __size;
                    }
                    do {
                      __size = sVar18;
                      sVar18 = (ulong)((uint)__size * 2);
                    } while ((uint)__size < uVar11);
                    psVar17 = (stbi_uc *)realloc(*ppsVar16,__size);
                    if (psVar17 == (stbi_uc *)0x0) {
                      stbi__g_failure_reason = "Out of memory";
                      local_524 = 0;
                      goto LAB_00114562;
                    }
                    *ppsVar16 = psVar17;
                  }
                  iVar10 = stbi__getn(s,*ppsVar16 + (local_4b8 & 0xffffffff),uVar14);
                  bVar5 = false;
                  if (iVar10 != 0) {
                    local_4b8 = (ulong)uVar11;
                    goto LAB_00115031;
                  }
                  stbi__g_failure_reason = "Corrupt PNG";
                }
              }
              else {
                stbi__g_failure_reason = "Corrupt PNG";
                local_4d8 = 0;
              }
              bVar5 = false;
              bVar4 = false;
              local_524 = 0;
            }
            else {
              if (uVar13 != 0x49454e44) {
LAB_001143ce:
                if (bVar5) goto LAB_00114405;
                if ((uVar12 >> 0xd & 1) != 0) {
                  bVar5 = false;
                  goto LAB_00114361;
                }
                stbi__g_failure_reason = "PNG not supported: unknown PNG chunk type";
                bVar5 = false;
                goto LAB_0011445f;
              }
              if (bVar5) {
LAB_00114295:
                stbi__g_failure_reason = "Corrupt PNG";
                local_524 = 0;
              }
              else if (scan == 0) {
                if (*ppsVar16 == (stbi_uc *)0x0) goto LAB_00114295;
                raw_len = s->img_n * s->img_y * (s->img_x * depth + 7 >> 3) + s->img_y;
                psVar17 = (stbi_uc *)
                          stbi_zlib_decode_malloc_guesssize_headerflag
                                    ((char *)*ppsVar16,iVar10,raw_len,(int *)&raw_len,(uint)!bVar6);
                z->expanded = psVar17;
                local_524 = 0;
                if (psVar17 != (stbi_uc *)0x0) {
                  free(*ppsVar16);
                  raw_len_00 = raw_len;
                  *ppsVar16 = (stbi_uc *)0x0;
                  iVar10 = s->img_n + 1;
                  if ((char)local_490 == '\0' &&
                      ((bVar25 != 0 || req_comp == 3) || iVar10 != req_comp)) {
                    s->img_out_n = s->img_n;
                  }
                  else {
                    s->img_out_n = iVar10;
                  }
                  iVar10 = s->img_out_n;
                  x = z->s->img_x;
                  y = z->s->img_y;
                  if ((int)local_460 == 0) {
                    iVar10 = stbi__create_png_image_raw
                                       (z,z->expanded,raw_len,iVar10,x,y,depth,(int)local_4b0);
                    if (iVar10 == 0) goto LAB_0011514c;
                  }
                  else {
                    local_4a8 = z->expanded;
                    local_480 = (long)iVar10;
                    local_498 = (stbi_uc *)malloc((ulong)(x * iVar10 * y));
                    lVar29 = 0;
                    psVar17 = local_4a8;
                    do {
                      psVar2 = z->s;
                      local_488 = (stbi_uc *)(long)(int)(&DAT_00121350)[lVar29];
                      uVar14 = (&DAT_00121390)[lVar29];
                      uVar27 = ~(&DAT_00121350)[lVar29] + psVar2->img_x + uVar14;
                      uVar13 = uVar27 / uVar14;
                      uVar11 = (&DAT_00121370)[lVar29];
                      uVar12 = (&DAT_001213b0)[lVar29];
                      uVar21 = ~uVar11 + psVar2->img_y + uVar12;
                      uVar15 = uVar21 / uVar12;
                      bVar3 = true;
                      if ((uVar14 <= uVar27) && (uVar12 <= uVar21)) {
                        local_464 = uVar13 * depth * psVar2->img_n;
                        local_4a8 = psVar17;
                        local_470 = (stbi__context *)(long)(int)uVar14;
                        local_458 = lVar29;
                        iVar10 = stbi__create_png_image_raw
                                           (z,psVar17,raw_len_00,(int)local_480,uVar13,uVar15,depth,
                                            (int)local_4b0);
                        if (iVar10 == 0) {
                          free(local_498);
                          bVar3 = false;
                          psVar17 = local_4a8;
                          lVar29 = local_458;
                        }
                        else {
                          if (0 < (int)uVar15) {
                            local_450 = (ulong)uVar15;
                            iVar10 = (int)local_480;
                            iVar26 = uVar11 * iVar10;
                            local_488 = local_498 + (long)local_488 * local_480;
                            lVar29 = (long)local_470 * local_480;
                            local_478 = 0;
                            do {
                              sVar18 = local_480;
                              if (0 < (int)uVar13) {
                                local_470 = z->s;
                                local_440 = z->out;
                                local_448 = local_478 * (long)(int)uVar13;
                                lVar28 = 0;
                                psVar17 = local_488;
                                do {
                                  memcpy(psVar17 + local_470->img_x * iVar26,
                                         local_440 + (local_448 + lVar28) * sVar18,sVar18);
                                  lVar28 = lVar28 + 1;
                                  psVar17 = psVar17 + lVar29;
                                } while (lVar28 < (int)uVar13);
                              }
                              local_478 = local_478 + 1;
                              iVar26 = iVar26 + uVar12 * iVar10;
                            } while (local_478 < local_450);
                          }
                          uVar15 = ((local_464 + 7 >> 3) + 1) * uVar15;
                          free(z->out);
                          raw_len_00 = raw_len_00 - uVar15;
                          bVar3 = true;
                          psVar17 = local_4a8 + uVar15;
                          lVar29 = local_458;
                        }
                      }
                      if (!bVar3) goto LAB_0011514c;
                      lVar29 = lVar29 + 1;
                    } while (lVar29 != 7);
                    z->out = local_498;
                  }
                  if ((char)local_490 != '\0') {
                    psVar17 = z->out;
                    iVar10 = z->s->img_y * z->s->img_x;
                    if (s->img_out_n == 2) {
                      if (iVar10 != 0) {
                        lVar29 = 0;
                        do {
                          psVar17[lVar29 * 2 + 1] = -(psVar17[lVar29 * 2] != tc[0]);
                          lVar29 = lVar29 + 1;
                        } while (iVar10 != (int)lVar29);
                      }
                    }
                    else {
                      if (s->img_out_n != 4) {
                        __assert_fail("out_n == 2 || out_n == 4",
                                      "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                                      ,0x105a,
                                      "int stbi__compute_transparency(stbi__png *, stbi_uc *, int)")
                        ;
                      }
                      if (iVar10 != 0) {
                        lVar29 = 0;
                        do {
                          if (((psVar17[lVar29 * 4] == tc[0]) && (psVar17[lVar29 * 4 + 1] == tc[1]))
                             && (psVar17[lVar29 * 4 + 2] == tc[2])) {
                            psVar17[lVar29 * 4 + 3] = '\0';
                          }
                          lVar29 = lVar29 + 1;
                        } while (iVar10 != (int)lVar29);
                      }
                    }
                  }
                  if (((bVar6) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
                    stbi__de_iphone(z);
                  }
                  if (bVar25 != 0) {
                    s->img_n = (uint)bVar25;
                    uVar14 = (uint)bVar25;
                    if (2 < req_comp) {
                      uVar14 = req_comp;
                    }
                    s->img_out_n = uVar14;
                    psVar17 = z->out;
                    uVar11 = z->s->img_y * z->s->img_x;
                    psVar19 = (stbi_uc *)malloc((ulong)(uVar11 * uVar14));
                    if (psVar19 == (stbi_uc *)0x0) {
                      stbi__g_failure_reason = "Out of memory";
                    }
                    else {
                      if (uVar14 == 3) {
                        if (uVar11 != 0) {
                          uVar22 = 0;
                          psVar23 = psVar19;
                          do {
                            uVar24 = (ulong)psVar17[uVar22];
                            *psVar23 = palette[uVar24 * 4];
                            psVar23[1] = palette[uVar24 * 4 + 1];
                            psVar23[2] = palette[uVar24 * 4 + 2];
                            psVar23 = psVar23 + 3;
                            uVar22 = uVar22 + 1;
                          } while (uVar11 != uVar22);
                        }
                      }
                      else if (uVar11 != 0) {
                        uVar22 = 0;
                        do {
                          uVar24 = (ulong)psVar17[uVar22];
                          psVar19[uVar22 * 4] = palette[uVar24 * 4];
                          psVar19[uVar22 * 4 + 1] = palette[uVar24 * 4 + 1];
                          psVar19[uVar22 * 4 + 2] = palette[uVar24 * 4 + 2];
                          psVar19[uVar22 * 4 + 3] = palette[uVar24 * 4 + 3];
                          uVar22 = uVar22 + 1;
                        } while (uVar11 != uVar22);
                      }
                      free(psVar17);
                      z->out = psVar19;
                    }
                    if (psVar19 == (stbi_uc *)0x0) goto LAB_0011514c;
                  }
                  free(z->expanded);
                  z->expanded = (stbi_uc *)0x0;
                  goto LAB_00114474;
                }
              }
              else {
LAB_00114474:
                local_524 = 1;
              }
LAB_0011514c:
              bVar4 = false;
            }
          }
        }
        else if (uVar13 == 0x74524e53) {
          if (bVar5) goto LAB_0011443a;
          if (*ppsVar16 == (stbi_uc *)0x0) {
            if (bVar25 == 0) {
              if (((s->img_n & 1U) != 0) && (uVar11 = s->img_n * 2, uVar11 == uVar14)) {
                local_490 = CONCAT71((uint7)(uint3)(uVar11 >> 8),1);
                if (0 < s->img_n) {
                  lVar29 = 0;
                  do {
                    iVar10 = stbi__get16be(s);
                    tc[lVar29] = ""[depth] * (char)iVar10;
                    lVar29 = lVar29 + 1;
                  } while (lVar29 < s->img_n);
                  bVar25 = 0;
                  goto LAB_001148f4;
                }
                bVar25 = 0;
LAB_0011452f:
                bVar5 = false;
                goto LAB_00115031;
              }
              bVar25 = 0;
              goto LAB_0011492b;
            }
            if (scan != 2) {
              if (uVar15 == 0) {
                local_4d8 = 0;
              }
              else if (uVar14 <= uVar15) {
                bVar25 = 4;
                if (uVar14 != 0) {
                  uVar22 = 0;
                  do {
                    psVar19 = s->img_buffer;
                    if (psVar19 < s->img_buffer_end) {
LAB_00114da4:
                      s->img_buffer = psVar19 + 1;
                      sVar8 = *psVar19;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar26 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                        if (iVar26 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar17;
                          s->img_buffer_end = psVar1;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar17;
                          s->img_buffer_end = psVar17 + iVar26;
                        }
                        psVar19 = s->img_buffer;
                        goto LAB_00114da4;
                      }
                      sVar8 = '\0';
                    }
                    palette[uVar22 * 4 + 3] = sVar8;
                    uVar22 = uVar22 + 1;
                    bVar25 = 4;
                  } while (uVar11 + iVar10 * 0x10000 != uVar22);
                }
                goto LAB_0011452f;
              }
              goto LAB_0011492b;
            }
            s->img_n = 4;
            local_524 = 1;
          }
          else {
LAB_0011492b:
            stbi__g_failure_reason = "Corrupt PNG";
            local_524 = 0;
          }
          bVar5 = false;
          bVar4 = false;
        }
        else {
          if (uVar13 == 0x504c5445) {
            if (!bVar5) {
              if ((0x300 < uVar14) ||
                 (local_4d8 = (ulong)uVar11 * 0x55555556 >> 0x20,
                 (int)((ulong)uVar11 * 0x55555556 >> 0x20) * 3 != uVar14)) goto LAB_0011492b;
              if (uVar11 < 3) goto LAB_0011452f;
              uVar22 = 0;
              do {
                psVar19 = s->img_buffer;
                if (psVar19 < s->img_buffer_end) {
LAB_001147cc:
                  s->img_buffer = psVar19 + 1;
                  sVar8 = *psVar19;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                    if (iVar10 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar17;
                      s->img_buffer_end = psVar1;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar17;
                      s->img_buffer_end = psVar17 + iVar10;
                    }
                    psVar19 = s->img_buffer;
                    goto LAB_001147cc;
                  }
                  sVar8 = '\0';
                }
                palette[uVar22 * 4] = sVar8;
                psVar19 = s->img_buffer;
                if (psVar19 < s->img_buffer_end) {
LAB_0011484b:
                  s->img_buffer = psVar19 + 1;
                  sVar8 = *psVar19;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                    if (iVar10 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar17;
                      s->img_buffer_end = psVar1;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar17;
                      s->img_buffer_end = psVar17 + iVar10;
                    }
                    psVar19 = s->img_buffer;
                    goto LAB_0011484b;
                  }
                  sVar8 = '\0';
                }
                palette[uVar22 * 4 + 1] = sVar8;
                psVar19 = s->img_buffer;
                if (psVar19 < s->img_buffer_end) {
LAB_001148ca:
                  s->img_buffer = psVar19 + 1;
                  sVar8 = *psVar19;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                    if (iVar10 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar17;
                      s->img_buffer_end = psVar1;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar17;
                      s->img_buffer_end = psVar17 + iVar10;
                    }
                    psVar19 = s->img_buffer;
                    goto LAB_001148ca;
                  }
                  sVar8 = '\0';
                }
                palette[uVar22 * 4 + 2] = sVar8;
                palette[uVar22 * 4 + 3] = 0xff;
                uVar22 = uVar22 + 1;
              } while (local_4d8 != uVar22);
LAB_001148f4:
              bVar5 = false;
              goto LAB_00115031;
            }
LAB_0011443a:
            stbi__g_failure_reason = "Corrupt PNG";
            bVar5 = true;
LAB_0011445f:
            local_524 = 0;
            bVar4 = false;
            goto LAB_0011514e;
          }
          if (uVar13 != 0x49484452) goto LAB_001143ce;
          if (bVar5) {
            if (uVar14 == 0xd) {
              iVar10 = stbi__get16be(s);
              uVar14 = stbi__get16be(s);
              uVar14 = uVar14 | iVar10 << 0x10;
              s->img_x = uVar14;
              if (uVar14 < 0x1000001) {
                iVar10 = stbi__get16be(s);
                uVar14 = stbi__get16be(s);
                uVar14 = uVar14 | iVar10 << 0x10;
                s->img_y = uVar14;
                if (uVar14 < 0x1000001) {
                  pbVar20 = s->img_buffer;
                  if (pbVar20 < s->img_buffer_end) {
LAB_00114ed6:
                    s->img_buffer = pbVar20 + 1;
                    bVar7 = *pbVar20;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar17 + iVar10;
                      }
                      pbVar20 = s->img_buffer;
                      goto LAB_00114ed6;
                    }
                    bVar7 = 0;
                  }
                  depth = (uint)bVar7;
                  if ((8 < bVar7) || ((0x116U >> (bVar7 & 0x1f) & 1) == 0)) {
                    stbi__g_failure_reason = "PNG not supported: 1/2/4/8-bit only";
                    goto LAB_00115014;
                  }
                  pbVar20 = s->img_buffer;
                  if (pbVar20 < s->img_buffer_end) {
LAB_00114fe9:
                    s->img_buffer = pbVar20 + 1;
                    bVar7 = *pbVar20;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar17,s->buflen);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar17 + iVar10;
                      }
                      pbVar20 = s->img_buffer;
                      goto LAB_00114fe9;
                    }
                    bVar7 = 0;
                  }
                  psVar17 = local_4a0;
                  local_4b0 = (ulong)bVar7;
                  if ((6 < bVar7) || ((bVar9 = 3, bVar7 != 3 && (bVar9 = bVar25, (bVar7 & 1) != 0)))
                     ) goto LAB_00115004;
                  bVar25 = bVar9;
                  psVar19 = s->img_buffer;
                  if (psVar19 < s->img_buffer_end) {
LAB_0011519c:
                    s->img_buffer = psVar19 + 1;
                    if (*psVar19 == '\0') goto LAB_001151ac;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)local_4a0,s->buflen);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar17;
                        s->img_buffer_end = psVar17 + iVar10;
                      }
                      psVar19 = s->img_buffer;
                      goto LAB_0011519c;
                    }
LAB_001151ac:
                    sVar8 = stbi__get8(s);
                    if (sVar8 == '\0') {
                      bVar9 = stbi__get8(s);
                      local_460 = (ulong)bVar9;
                      if (((bVar9 < 2) && (uVar14 = s->img_x, uVar14 != 0)) &&
                         (uVar11 = s->img_y, uVar11 != 0)) {
                        if (bVar25 == 0) {
                          uVar12 = (uint)(3 < bVar7) + ((uint)local_4b0 & 2) + 1;
                          s->img_n = uVar12;
                          if ((uint)((0x40000000 / (ulong)uVar14) / (ulong)uVar12) < uVar11) {
                            stbi__g_failure_reason = "Image too large to decode";
                            bVar25 = 0;
                            goto LAB_00115014;
                          }
                          if (scan == 2) {
                            local_524 = 1;
                            bVar3 = false;
                            bVar25 = 0;
                            goto LAB_0011501c;
                          }
                        }
                        else {
                          s->img_n = 1;
                          if ((uint)(0x40000000 / (ulong)uVar14 >> 2) < uVar11) goto LAB_001151fe;
                        }
                        bVar3 = true;
                        goto LAB_0011501c;
                      }
                    }
                  }
LAB_001151fe:
                  stbi__g_failure_reason = "Corrupt PNG";
                  goto LAB_00115014;
                }
              }
              stbi__g_failure_reason = "Very large image (corrupt?)";
            }
            else {
LAB_00115004:
              stbi__g_failure_reason = "Corrupt PNG";
            }
LAB_00115014:
            bVar3 = false;
            local_524 = 0;
          }
          else {
            stbi__g_failure_reason = "Corrupt PNG";
            bVar3 = false;
            local_524 = 0;
          }
LAB_0011501c:
          bVar5 = false;
          bVar4 = false;
          if (bVar3) goto LAB_00115031;
        }
LAB_0011514e:
      } while (bVar4);
    }
  }
  return local_524;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, depth=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            depth = stbi__get8(s);  if (depth != 1 && depth != 2 && depth != 4 && depth != 8)  return stbi__err("1/2/4/8-bit only","PNG not supported: 1/2/4/8-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               for (k=0; k < s->img_n; ++k)
                  tc[k] = (stbi_uc) (stbi__get16be(s) & 255) * stbi__depth_scale_table[depth]; // non 8-bit images will be larger
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               p = (stbi_uc *) STBI_REALLOC(z->idata, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, depth, color, interlace)) return 0;
            if (has_trans)
               if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}